

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

void __thiscall cfd::core::Pubkey::Pubkey(Pubkey *this,string *hex_string)

{
  ByteData local_30;
  string *local_18;
  string *hex_string_local;
  Pubkey *this_local;
  
  local_18 = hex_string;
  hex_string_local = (string *)this;
  ByteData::ByteData(&local_30,hex_string);
  Pubkey(this,&local_30);
  ByteData::~ByteData(&local_30);
  return;
}

Assistant:

Pubkey::Pubkey(const std::string &hex_string) : Pubkey(ByteData(hex_string)) {
  // do nothing
}